

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

string * __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::GetDictNum_abi_cxx11_
          (string *__return_storage_ptr__,DictionaryPrinter *this,size_t index,size_t size)

{
  size_t sVar1;
  char buf [64];
  char acStack_58 [72];
  
  snprintf(acStack_58,0x40,"%lu of %lu",index,size);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_58);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_58,acStack_58 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

string GetDictNum(size_t index, size_t size) const {
    char buf[64];   // big enough for two ints
    snprintf(buf, sizeof(buf), "%" PRIuS " of %" PRIuS, index, size);
    return buf;
  }